

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O0

void * metacallfv_s(void *func,void **args,size_t size)

{
  int iVar1;
  type_id tVar2;
  type_id tVar3;
  type_id tVar4;
  signature s_00;
  type ptVar5;
  value pvVar6;
  function_return pvVar7;
  function_return pvVar8;
  ulong in_RDX;
  long in_RSI;
  function_conflict in_RDI;
  value cast_ret;
  type_id id_1;
  type t_1;
  value cast_arg;
  type_id id;
  type t;
  value ret;
  size_t iterator;
  signature s;
  function f;
  size_t in_stack_ffffffffffffff78;
  void **in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  type_id in_stack_ffffffffffffff8c;
  value in_stack_ffffffffffffff90;
  ulong local_38;
  value in_stack_fffffffffffffff8;
  
  if (in_RDI == (function_conflict)0x0) {
    pvVar8 = (function_return)0x0;
  }
  else {
    s_00 = function_signature(in_RDI);
    for (local_38 = 0; tVar2 = (type_id)((ulong)in_RDI >> 0x20), local_38 < in_RDX;
        local_38 = local_38 + 1) {
      iVar1 = value_validate(in_stack_ffffffffffffff80);
      if (iVar1 != 0) {
        log_write_impl_va("metacall",0x477,"metacallfv_s",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                          ,LOG_LEVEL_ERROR,
                          "Invalid argument at position %zu when calling to metacallfv_s",local_38);
        return (void *)0x0;
      }
      ptVar5 = signature_get_type((signature)
                                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                  (size_t)in_stack_ffffffffffffff80);
      if (ptVar5 != (type)0x0) {
        in_stack_ffffffffffffff8c = type_index(ptVar5);
        tVar2 = value_type_id(in_stack_ffffffffffffff90);
        if ((in_stack_ffffffffffffff8c != tVar2) &&
           (pvVar6 = value_type_cast(in_stack_fffffffffffffff8,(type_id)((ulong)in_RDI >> 0x20)),
           pvVar6 != (value)0x0)) {
          *(value *)(in_RSI + local_38 * 8) = pvVar6;
        }
      }
    }
    pvVar7 = function_call((function_conflict)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                           in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    pvVar8 = pvVar7;
    if ((pvVar7 != (function_return)0x0) &&
       (ptVar5 = signature_get_return(s_00), ptVar5 != (type)0x0)) {
      tVar3 = type_index(ptVar5);
      tVar4 = value_type_id(in_stack_ffffffffffffff90);
      if ((tVar3 != tVar4) &&
         (pvVar8 = value_type_cast(in_stack_fffffffffffffff8,tVar2), pvVar8 == (value)0x0)) {
        pvVar8 = pvVar7;
      }
    }
  }
  return pvVar8;
}

Assistant:

void *metacallfv_s(void *func, void *args[], size_t size)
{
	function f = (function)func;

	if (f != NULL)
	{
		signature s = function_signature(f);

		size_t iterator;

		value ret;

		for (iterator = 0; iterator < size; ++iterator)
		{
			if (value_validate(args[iterator]) != 0)
			{
				// TODO: Implement type error return a value
				log_write("metacall", LOG_LEVEL_ERROR, "Invalid argument at position %" PRIuS " when calling to metacallfv_s", iterator);
				return NULL;
			}

			type t = signature_get_type(s, iterator);

			if (t != NULL)
			{
				type_id id = type_index(t);

				if (id != value_type_id((value)args[iterator]))
				{
					value cast_arg = value_type_cast((value)args[iterator], id);

					if (cast_arg != NULL)
					{
						args[iterator] = cast_arg;
					}
				}
			}
		}

		ret = function_call(f, args, size);

		if (ret != NULL)
		{
			type t = signature_get_return(s);

			if (t != NULL)
			{
				type_id id = type_index(t);

				if (id != value_type_id(ret))
				{
					value cast_ret = value_type_cast(ret, id);

					return (cast_ret == NULL) ? ret : cast_ret;
				}
			}
		}

		return ret;
	}

	return NULL;
}